

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTaskExecutor.h
# Opt level: O0

void HighsTaskExecutor::initialize(int numThreads)

{
  ExecutorHandle *pEVar1;
  HighsTaskExecutor *pHVar2;
  size_t unaff_retaddr;
  ExecutorHandle *executorHandle;
  int in_stack_00000084;
  HighsTaskExecutor *in_stack_00000088;
  
  pEVar1 = threadLocalExecutorHandle();
  if (pEVar1->ptr == (HighsTaskExecutor *)0x0) {
    pEVar1->isMain = true;
    pHVar2 = (HighsTaskExecutor *)::highs::cache_aligned::alloc(unaff_retaddr);
    HighsTaskExecutor(in_stack_00000088,in_stack_00000084);
    pEVar1->ptr = pHVar2;
  }
  return;
}

Assistant:

static void initialize(int numThreads) {
    auto& executorHandle = threadLocalExecutorHandle();
    if (executorHandle.ptr == nullptr) {
      executorHandle.isMain = true;
      executorHandle.ptr = new (cache_aligned::alloc(sizeof(HighsTaskExecutor)))
          HighsTaskExecutor(numThreads);
    }
  }